

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencnvex.c
# Opt level: O0

UBool CnvExtAddTable(NewConverter *cnvData,UCMTable *table,UConverterStaticData *staticData)

{
  UBool UVar1;
  bool local_31;
  CnvExtData *extData;
  UConverterStaticData *staticData_local;
  UCMTable *table_local;
  NewConverter *cnvData_local;
  
  if ((table->unicodeMask & 2) == 0) {
    staticData->conversionType = '\x02';
    UVar1 = makeToUTable((CnvExtData *)cnvData,table);
    local_31 = false;
    if (UVar1 != '\0') {
      UVar1 = makeFromUTable((CnvExtData *)cnvData,table);
      local_31 = UVar1 != '\0';
    }
    cnvData_local._7_1_ = local_31;
  }
  else {
    fprintf(_stderr,"error: contains mappings for surrogate code points\n");
    cnvData_local._7_1_ = false;
  }
  return cnvData_local._7_1_;
}

Assistant:

static UBool
CnvExtAddTable(NewConverter *cnvData, UCMTable *table, UConverterStaticData *staticData) {
    CnvExtData *extData;

    if(table->unicodeMask&UCNV_HAS_SURROGATES) {
        fprintf(stderr, "error: contains mappings for surrogate code points\n");
        return FALSE;
    }

    staticData->conversionType=UCNV_MBCS;

    extData=(CnvExtData *)cnvData;

    /*
     * assume that the table is sorted
     *
     * call the functions in this order because
     * makeToUTable() modifies the original reverseMap,
     * makeFromUTable() writes a whole new mapping into reverseMap
     */
    return
        makeToUTable(extData, table) &&
        makeFromUTable(extData, table);
}